

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O2

void mbedtls_pk_free(mbedtls_pk_context *ctx)

{
  _func_void_void_ptr *p_Var1;
  
  if (ctx != (mbedtls_pk_context *)0x0) {
    if ((ctx->pk_info != (mbedtls_pk_info_t *)0x0) &&
       (p_Var1 = ctx->pk_info->ctx_free_func, p_Var1 != (_func_void_void_ptr *)0x0)) {
      (*p_Var1)(ctx->pk_ctx);
    }
    mbedtls_platform_zeroize(ctx,0x10);
    return;
  }
  return;
}

Assistant:

void mbedtls_pk_free(mbedtls_pk_context *ctx)
{
    if (ctx == NULL) {
        return;
    }

    if ((ctx->pk_info != NULL) && (ctx->pk_info->ctx_free_func != NULL)) {
        ctx->pk_info->ctx_free_func(ctx->pk_ctx);
    }

#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    /* The ownership of the priv_id key for opaque keys is external of the PK
     * module. It's the user responsibility to clear it after use. */
    if ((ctx->pk_info != NULL) && (ctx->pk_info->type != MBEDTLS_PK_OPAQUE)) {
        psa_destroy_key(ctx->priv_id);
    }
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_pk_context));
}